

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O1

ImageT<unsigned_char,_3U> * __thiscall
ImageT<unsigned_char,_3U>::swizzle(ImageT<unsigned_char,_3U> *this,string_view swizzle)

{
  Color *pCVar1;
  uchar uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Color srcPixel;
  anon_union_3_2_6556a7fb_for_color<unsigned_char,_3U>_3 local_3c;
  ulong local_38;
  
  if (swizzle._M_len == 4) {
    if ((this->super_Image).height * (this->super_Image).width != 0) {
      uVar6 = 0;
      do {
        local_3c.comps[2] = this->pixels[uVar6].field_0.comps[2];
        local_3c._0_2_ = *(undefined2 *)&this->pixels[uVar6].field_0;
        local_38 = uVar6;
        iVar3 = (*(this->super_Image)._vptr_Image[5])(this);
        if (iVar3 != 0) {
          uVar7 = 0;
          do {
            pCVar1 = this->pixels;
            uVar2 = swizzlePixel(this,(Color *)&local_3c.field_1,swizzle._M_str[uVar7]);
            uVar5 = 2;
            if ((uint)uVar7 < 2) {
              uVar5 = uVar7 & 0xffffffff;
            }
            pCVar1[uVar6].field_0.comps[uVar5] = uVar2;
            uVar7 = uVar7 + 1;
            uVar4 = (*(this->super_Image)._vptr_Image[5])(this);
          } while (uVar7 < uVar4);
        }
        uVar6 = local_38 + 1;
      } while (uVar6 < (this->super_Image).height * (this->super_Image).width);
    }
    return this;
  }
  __assert_fail("swizzle.size() == 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                ,0x4fe,
                "virtual ImageT<componentType, componentCount> &ImageT<unsigned char, 3>::swizzle(std::string_view) [componentType = unsigned char, componentCount = 3]"
               );
}

Assistant:

virtual ImageT& swizzle(std::string_view swizzle) override {
        assert(swizzle.size() == 4);
        for (size_t i = 0; i < getPixelCount(); i++) {
            Color srcPixel = pixels[i];
            for (uint32_t c = 0; c < getComponentCount(); c++) {
                pixels[i].set(c, swizzlePixel(srcPixel, swizzle[c]));
            }
        }
        return *this;
    }